

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::interval_t,duckdb::interval_t,duckdb::BinaryStandardOperatorWrapper,duckdb::DateTruncBinaryOperator,bool,false,true>
               (string_t *ldata,interval_t *rdata,interval_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  interval_t iVar10;
  interval_t iVar11;
  string_t specifier;
  string_t specifier_00;
  string_t specifier_01;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      iVar11 = *rdata;
      lVar5 = 8;
      do {
        specifier_01.value.pointer.ptr = (char *)*(undefined8 *)((long)&ldata->value + lVar5);
        specifier_01.value._0_8_ = *(undefined8 *)((long)ldata + lVar5 + -8);
        iVar10 = DateTruncBinaryOperator::
                 Operation<duckdb::string_t,duckdb::interval_t,duckdb::interval_t>
                           (specifier_01,iVar11);
        *(long *)((long)result_data + lVar5 + -8) = iVar10._0_8_;
        *(int64_t *)((long)&result_data->months + lVar5) = iVar10.micros;
        lVar5 = lVar5 + 0x10;
        count = count - 1;
      } while (count != 0);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar3 = 0;
    uVar7 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar2 = uVar7 + 0x40;
        if (count <= uVar7 + 0x40) {
          uVar2 = count;
        }
LAB_0062bfe8:
        uVar9 = uVar7;
        if (uVar7 < uVar2) {
          iVar11 = *rdata;
          uVar4 = uVar7 << 4 | 8;
          do {
            specifier.value.pointer.ptr = (char *)*(undefined8 *)((long)&ldata->value + uVar4);
            specifier.value._0_8_ = *(undefined8 *)((long)ldata + (uVar4 - 8));
            iVar10 = DateTruncBinaryOperator::
                     Operation<duckdb::string_t,duckdb::interval_t,duckdb::interval_t>
                               (specifier,iVar11);
            *(long *)((long)result_data + (uVar4 - 8)) = iVar10._0_8_;
            *(int64_t *)((long)&result_data->months + uVar4) = iVar10.micros;
            uVar7 = uVar7 + 1;
            uVar4 = uVar4 + 0x10;
            uVar9 = uVar2;
          } while (uVar2 != uVar7);
        }
      }
      else {
        uVar4 = puVar1[uVar3];
        uVar2 = uVar7 + 0x40;
        if (count <= uVar7 + 0x40) {
          uVar2 = count;
        }
        uVar9 = uVar2;
        if (uVar4 != 0) {
          if (uVar4 == 0xffffffffffffffff) goto LAB_0062bfe8;
          uVar9 = uVar7;
          if (uVar7 < uVar2) {
            uVar8 = uVar7 << 4 | 8;
            uVar6 = 0;
            do {
              if ((uVar4 >> (uVar6 & 0x3f) & 1) != 0) {
                specifier_00.value.pointer.ptr =
                     (char *)*(undefined8 *)((long)&ldata->value + uVar8);
                specifier_00.value._0_8_ = *(undefined8 *)((long)ldata + (uVar8 - 8));
                iVar11 = DateTruncBinaryOperator::
                         Operation<duckdb::string_t,duckdb::interval_t,duckdb::interval_t>
                                   (specifier_00,*rdata);
                *(long *)((long)result_data + (uVar8 - 8)) = iVar11._0_8_;
                *(int64_t *)((long)&result_data->months + uVar8) = iVar11.micros;
              }
              uVar6 = uVar6 + 1;
              uVar8 = uVar8 + 0x10;
              uVar9 = uVar2;
            } while (uVar2 - uVar7 != uVar6);
          }
        }
      }
      uVar3 = uVar3 + 1;
      uVar7 = uVar9;
    } while (uVar3 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}